

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O1

int testSpanTestsIteratorImmutableExplicitRBeginREnd(void)

{
  long lVar1;
  pointer piVar2;
  ostream *poVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  int local_28 [4];
  
  local_28[0] = 1;
  local_28[1] = 2;
  local_28[2] = 3;
  local_28[3] = 4;
  __l._M_len = 4;
  __l._M_array = local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,&local_41);
  piVar2 = (pointer)0x0;
  if ((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    piVar2 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  }
  lVar1 = (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  iVar6 = 4;
  do {
    lVar4 = lVar1;
    if (lVar4 == 0) goto LAB_001cb822;
    iVar5 = iVar6 + -1;
    bVar7 = iVar6 == *(int *)((long)piVar2 + lVar4 + -4);
    lVar1 = lVar4 + -4;
    iVar6 = iVar5;
  } while (bVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
             ,0x71);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x151);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(*itr) == (counter--)",0x15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
LAB_001cb822:
  iVar5 = 1;
  if (lVar4 == 0) {
    if (iVar6 == 0) {
      iVar5 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                 ,0x71);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x153);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(counter) == (0)",0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar5;
}

Assistant:

int testSpanTestsIteratorImmutableExplicitRBeginREnd()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    int counter = 4;
    for (auto itr = span.rbegin(); itr != span.rend(); ++itr) {
        static_assert(std::is_same<decltype(*itr), const int&>::value, "iterator must be const");
        ML_ASSERT_EQ(*itr, counter--);
    }
    ML_ASSERT_EQ(counter, 0);

    return 0;
}